

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed-message.h
# Opt level: O1

bool rtosc::
     validate<1,int,irqus::typestring<(char)115,(char)101,(char)110,(char)100,(char)45,(char)116,(char)111>>
               (char *arg)

{
  char cVar1;
  bool bVar2;
  
  cVar1 = rtosc_type(arg,1);
  if (cVar1 == 'i') {
    bVar2 = validate<2,irqus::typestring<(char)115,(char)101,(char)110,(char)100,(char)45,(char)116,(char)111>>
                      (arg);
    return bVar2;
  }
  return false;
}

Assistant:

bool validate(const char *arg)
{
    advance_size<This> size;
    if(size && !valid_char<This>(rtosc_type(arg,i)))
        return false;
    else if(!size && !match_path<This>(size, arg))
        return false;
    else
        return validate<i+size.value,Rest...>(arg);
}